

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::base_sink<spdlog::details::null_mutex>::set_pattern_
          (base_sink<spdlog::details::null_mutex> *this,string *pattern)

{
  _Head_base<0UL,_spdlog::pattern_formatter_*,_false> _Var1;
  _Head_base<0UL,_spdlog::pattern_formatter_*,_false> local_18;
  
  details::make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&>
            ((details *)&local_18,pattern);
  _Var1._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (pattern_formatter *)0x0;
  (*(this->super_sink)._vptr_sink[9])(this);
  if (_Var1._M_head_impl != (pattern_formatter *)0x0) {
    (*((_Var1._M_head_impl)->super_formatter)._vptr_formatter[1])();
  }
  std::unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
  ~unique_ptr((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
               *)&local_18);
  return;
}

Assistant:

void SPDLOG_INLINE spdlog::sinks::base_sink<Mutex>::set_pattern_(const std::string &pattern) {
    set_formatter_(details::make_unique<spdlog::pattern_formatter>(pattern));
}